

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O2

void TxToUniv(CTransaction *tx,uint256 *block_hash,UniValue *entry,bool include_hex,CTxUndo *txundo,
             TxVerbosity verbosity)

{
  CScript *pCVar1;
  CScript *pCVar2;
  pointer pvVar3;
  uchar *puVar4;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string str;
  string str_00;
  string key_06;
  string key_07;
  string key_08;
  string str_01;
  string key_09;
  string key_10;
  string key_11;
  string str_02;
  string key_12;
  string str_03;
  string str_04;
  string key_13;
  string key_14;
  string key_15;
  string key_16;
  string key_17;
  string key_18;
  string key_19;
  string str_05;
  string str_06;
  string key_20;
  string key_21;
  string str_07;
  string key_22;
  string key_23;
  string key_24;
  string key_25;
  string key_26;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  UniValue val_10;
  UniValue val_11;
  UniValue val_12;
  UniValue val_13;
  UniValue val_14;
  UniValue val_15;
  UniValue val_16;
  UniValue val_17;
  UniValue val_18;
  UniValue val_19;
  UniValue val_20;
  UniValue val_21;
  UniValue val_22;
  UniValue val_23;
  UniValue val_24;
  UniValue val_25;
  UniValue val_26;
  UniValue val_27;
  UniValue val_28;
  UniValue val_29;
  bool bVar5;
  VType VVar6;
  int32_t iVar7;
  CTxUndo *pCVar8;
  undefined7 in_register_00000009;
  uint uVar9;
  int iVar10;
  uint uVar11;
  CAmount *pCVar12;
  pointer pCVar13;
  ulong uVar14;
  undefined4 uVar15;
  vector<Coin,_std::allocator<Coin>_> *pvVar16;
  pointer pvVar17;
  pointer pCVar18;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  undefined8 in_stack_ffffffffffffeec8;
  CTransaction *pCVar19;
  undefined8 in_stack_ffffffffffffeed8;
  pointer pCVar20;
  ulong in_stack_ffffffffffffeee0;
  undefined8 in_stack_ffffffffffffeee8;
  long lVar21;
  undefined8 in_stack_ffffffffffffeef0;
  undefined4 in_stack_ffffffffffffeef8;
  undefined8 in_stack_ffffffffffffef00;
  UniValue *pUVar22;
  undefined8 in_stack_ffffffffffffef08;
  base_blob<256u> *pbVar23;
  ulong in_stack_ffffffffffffef10;
  undefined7 in_stack_ffffffffffffef18;
  allocator<char> in_stack_ffffffffffffef1f;
  undefined1 in_stack_ffffffffffffef20 [32];
  string local_1088 [32];
  UniValue local_1068;
  string local_1010 [32];
  UniValue local_ff0;
  string local_f98 [32];
  UniValue local_f78;
  string local_f20 [32];
  UniValue local_f00;
  UniValue local_ea8;
  string local_e50 [32];
  undefined1 *local_e30;
  undefined8 local_e28;
  undefined1 local_e20 [16];
  UniValue local_e10;
  string local_db8 [32];
  UniValue local_d98;
  string local_d40 [32];
  undefined1 *local_d20;
  undefined8 local_d18;
  undefined1 local_d10 [16];
  undefined1 *local_d00;
  undefined8 local_cf8;
  undefined1 local_cf0 [16];
  UniValue local_ce0;
  string local_c88 [32];
  UniValue local_c68;
  UniValue local_c10;
  string local_bb8 [32];
  UniValue local_b98;
  string local_b40 [32];
  UniValue local_b20;
  string local_ac8 [32];
  UniValue local_aa8;
  string local_a50 [32];
  UniValue local_a30;
  string local_9d8 [32];
  UniValue local_9b8;
  string local_960 [32];
  undefined1 *local_940;
  undefined8 local_938;
  undefined1 local_930 [16];
  UniValue p;
  undefined1 *local_8c8;
  undefined8 local_8c0;
  undefined1 local_8b8 [16];
  UniValue local_8a8;
  string local_850 [32];
  UniValue local_830;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined1 local_7c8 [16];
  UniValue local_7b8;
  string local_760 [32];
  UniValue local_740;
  string local_6e8 [32];
  UniValue local_6c8;
  string local_670 [32];
  undefined1 *local_650;
  undefined8 local_648;
  undefined1 local_640 [16];
  UniValue o;
  UniValue local_5d8;
  string local_580 [32];
  UniValue local_560;
  string local_508 [32];
  UniValue local_4e8;
  string local_490 [32];
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460 [16];
  UniValue vout;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [16];
  UniValue vin;
  UniValue local_380;
  string local_328 [32];
  UniValue local_308;
  string local_2b0 [32];
  UniValue local_290;
  string local_238 [32];
  UniValue local_218;
  string local_1c0 [32];
  UniValue local_1a0;
  string local_148 [32];
  UniValue local_128;
  string local_d0 [32];
  UniValue local_b0;
  string local_58 [32];
  long local_38;
  
  local_1068.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  vin.typ._0_1_ = 0 < (int)verbosity;
  inline_check_non_fatal<bool>
            ((bool *)&vin,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/core_write.cpp"
             ,0xad,"TxToUniv","verbosity >= TxVerbosity::SHOW_DETAILS");
  std::__cxx11::string::string<std::allocator<char>>(local_58,"txid",(allocator<char> *)&vout);
  base_blob<256u>::GetHex_abi_cxx11_((string *)&vin,(base_blob<256u> *)&tx->hash);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vin);
  key._M_string_length = (size_type)tx;
  key._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  key.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  key.field_2._8_8_ = in_stack_ffffffffffffeee0;
  val_02.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeef0;
  val_02._0_8_ = in_stack_ffffffffffffeee8;
  val_02.val._M_string_length._0_4_ = in_stack_ffffffffffffeef8;
  val_02.val._M_string_length._4_4_ = verbosity;
  val_02.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef00;
  val_02.val.field_2._8_8_ = in_stack_ffffffffffffef08;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
  UniValue::pushKV(entry,key,val_02);
  UniValue::~UniValue(&local_b0);
  std::__cxx11::string::~string((string *)&vin);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"hash",(allocator<char> *)&vout);
  base_blob<256u>::GetHex_abi_cxx11_((string *)&vin,(base_blob<256u> *)&tx->m_witness_hash);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vin);
  key_00._M_string_length = (size_type)tx;
  key_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  key_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  key_00.field_2._8_8_ = in_stack_ffffffffffffeee0;
  val_03.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeef0;
  val_03._0_8_ = in_stack_ffffffffffffeee8;
  val_03.val._M_string_length._0_4_ = in_stack_ffffffffffffeef8;
  val_03.val._M_string_length._4_4_ = verbosity;
  val_03.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef00;
  val_03.val.field_2._8_8_ = in_stack_ffffffffffffef08;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
  UniValue::pushKV(entry,key_00,val_03);
  UniValue::~UniValue(&local_128);
  std::__cxx11::string::~string((string *)&vin);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::string<std::allocator<char>>(local_148,"version",(allocator<char> *)&vin);
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_1a0,&tx->version);
  key_01._M_string_length = (size_type)tx;
  key_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  key_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  key_01.field_2._8_8_ = in_stack_ffffffffffffeee0;
  val_04.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeef0;
  val_04._0_8_ = in_stack_ffffffffffffeee8;
  val_04.val._M_string_length._0_4_ = in_stack_ffffffffffffeef8;
  val_04.val._M_string_length._4_4_ = verbosity;
  val_04.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef00;
  val_04.val.field_2._8_8_ = in_stack_ffffffffffffef08;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
  UniValue::pushKV(entry,key_01,val_04);
  UniValue::~UniValue(&local_1a0);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"size",(allocator<char> *)&vout);
  VVar6 = CTransaction::GetTotalSize(tx);
  vin.typ = VVar6;
  UniValue::UniValue<unsigned_int,_unsigned_int,_true>(&local_218,&vin.typ);
  key_02._M_string_length = (size_type)tx;
  key_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  key_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  key_02.field_2._8_8_ = in_stack_ffffffffffffeee0;
  val_05.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeef0;
  val_05._0_8_ = in_stack_ffffffffffffeee8;
  val_05.val._M_string_length._0_4_ = in_stack_ffffffffffffeef8;
  val_05.val._M_string_length._4_4_ = verbosity;
  val_05.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef00;
  val_05.val.field_2._8_8_ = in_stack_ffffffffffffef08;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
  UniValue::pushKV(entry,key_02,val_05);
  UniValue::~UniValue(&local_218);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::string<std::allocator<char>>(local_238,"vsize",(allocator<char> *)&vout);
  iVar7 = GetTransactionWeight(tx);
  vin.typ = (iVar7 + 3) / 4;
  UniValue::UniValue<int,_int,_true>(&local_290,(int *)&vin);
  key_03._M_string_length = (size_type)tx;
  key_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  key_03.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  key_03.field_2._8_8_ = in_stack_ffffffffffffeee0;
  val_06.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeef0;
  val_06._0_8_ = in_stack_ffffffffffffeee8;
  val_06.val._M_string_length._0_4_ = in_stack_ffffffffffffeef8;
  val_06.val._M_string_length._4_4_ = verbosity;
  val_06.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef00;
  val_06.val.field_2._8_8_ = in_stack_ffffffffffffef08;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
  UniValue::pushKV(entry,key_03,val_06);
  UniValue::~UniValue(&local_290);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"weight",(allocator<char> *)&vout);
  vin.typ = GetTransactionWeight(tx);
  UniValue::UniValue<int,_int,_true>(&local_308,(int *)&vin);
  key_04._M_string_length = (size_type)tx;
  key_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  key_04.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  key_04.field_2._8_8_ = in_stack_ffffffffffffeee0;
  val_07.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeef0;
  val_07._0_8_ = in_stack_ffffffffffffeee8;
  val_07.val._M_string_length._0_4_ = in_stack_ffffffffffffeef8;
  val_07.val._M_string_length._4_4_ = verbosity;
  val_07.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef00;
  val_07.val.field_2._8_8_ = in_stack_ffffffffffffef08;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
  UniValue::pushKV(entry,key_04,val_07);
  UniValue::~UniValue(&local_308);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::string<std::allocator<char>>(local_328,"locktime",(allocator<char> *)&vout);
  vin._0_8_ = ZEXT48(tx->nLockTime);
  UniValue::UniValue<long,_long,_true>(&local_380,(long *)&vin);
  uVar15 = (undefined4)CONCAT71(in_register_00000009,include_hex);
  key_05._M_string_length = (size_type)tx;
  key_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  key_05.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  key_05.field_2._8_8_ = in_stack_ffffffffffffeee0;
  val_08.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeef0;
  val_08._0_8_ = in_stack_ffffffffffffeee8;
  val_08.val._M_string_length._0_4_ = uVar15;
  val_08.val._M_string_length._4_4_ = verbosity;
  val_08.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef00;
  val_08.val.field_2._8_8_ = in_stack_ffffffffffffef08;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
  UniValue::pushKV(entry,key_05,val_08);
  UniValue::~UniValue(&local_380);
  std::__cxx11::string::~string(local_328);
  local_3f8 = local_3e8;
  local_3f0 = 0;
  local_3e8[0] = 0;
  str._M_string_length = (size_type)tx;
  str._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
  str.field_2._M_allocated_capacity = in_stack_ffffffffffffeed8;
  str.field_2._8_8_ = in_stack_ffffffffffffeee0;
  UniValue::UniValue(&vin,VARR,str);
  std::__cxx11::string::~string((string *)&local_3f8);
  uVar11 = 0;
  lVar21 = 0;
  do {
    uVar14 = (ulong)uVar11;
    pCVar20 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar20) / 0x68) <= uVar14) {
      std::__cxx11::string::string<std::allocator<char>>(local_c88,"vin",(allocator<char> *)&vout);
      UniValue::UniValue(&local_ce0,&vin);
      key_19._M_string_length = (size_type)tx;
      key_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_19.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_19.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_22.val._M_dataplus._M_p = (pointer)txundo;
      val_22._0_8_ = lVar21;
      val_22.val._M_string_length._0_4_ = uVar15;
      val_22.val._M_string_length._4_4_ = verbosity;
      val_22.val.field_2._M_allocated_capacity = (size_type)entry;
      val_22.val.field_2._8_8_ = block_hash;
      val_22.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_22.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_22.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_22.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_22.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(entry,key_19,val_22);
      UniValue::~UniValue(&local_ce0);
      std::__cxx11::string::~string(local_c88);
      local_d00 = local_cf0;
      local_cf8 = 0;
      local_cf0[0] = 0;
      str_05._M_string_length = (size_type)tx;
      str_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      str_05.field_2._M_allocated_capacity = (size_type)pCVar20;
      str_05.field_2._8_8_ = in_stack_ffffffffffffeee0;
      UniValue::UniValue(&vout,VARR,str_05);
      std::__cxx11::string::~string((string *)&local_d00);
      pvVar16 = (vector<Coin,_std::allocator<Coin>_> *)0x0;
      uVar11 = 0;
      while( true ) {
        pCVar18 = (pointer)(ulong)uVar11;
        pCVar13 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((pointer)(((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pCVar13) / 0x28) <= pCVar18)
        break;
        local_d20 = local_d10;
        local_d18 = 0;
        local_d10[0] = 0;
        str_06._M_string_length = (size_type)tx;
        str_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        str_06.field_2._M_allocated_capacity = (size_type)pCVar20;
        str_06.field_2._8_8_ = in_stack_ffffffffffffeee0;
        UniValue::UniValue(&o,VOBJ,str_06);
        std::__cxx11::string::~string((string *)&local_d20);
        std::__cxx11::string::string<std::allocator<char>>(local_d40,"value",(allocator<char> *)&p);
        pCVar13 = pCVar13 + (long)pCVar18;
        ValueFromAmount(&local_d98,pCVar13->nValue);
        key_20._M_string_length = (size_type)tx;
        key_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        key_20.field_2._M_allocated_capacity = (size_type)pCVar18;
        key_20.field_2._8_8_ = in_stack_ffffffffffffeee0;
        val_23.val._M_dataplus._M_p = (pointer)txundo;
        val_23._0_8_ = lVar21;
        val_23.val._M_string_length._0_4_ = uVar15;
        val_23.val._M_string_length._4_4_ = verbosity;
        val_23.val.field_2._M_allocated_capacity = (size_type)entry;
        val_23.val.field_2._8_8_ = block_hash;
        val_23.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
        val_23.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
        val_23.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
        val_23.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_ffffffffffffef20._0_8_;
        val_23.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
        UniValue::pushKV(&o,key_20,val_23);
        UniValue::~UniValue(&local_d98);
        std::__cxx11::string::~string(local_d40);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_db8,"n",(allocator<char> *)&stack0xffffffffffffef10);
        p._0_8_ = pCVar18;
        UniValue::UniValue<long,_long,_true>(&local_e10,(long *)&p);
        key_21._M_string_length = (size_type)tx;
        key_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        key_21.field_2._M_allocated_capacity = (size_type)pCVar18;
        key_21.field_2._8_8_ = in_stack_ffffffffffffeee0;
        val_24.val._M_dataplus._M_p = (pointer)txundo;
        val_24._0_8_ = lVar21;
        val_24.val._M_string_length._0_4_ = uVar15;
        val_24.val._M_string_length._4_4_ = verbosity;
        val_24.val.field_2._M_allocated_capacity = (size_type)entry;
        val_24.val.field_2._8_8_ = block_hash;
        val_24.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
        val_24.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
        val_24.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
        val_24.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_ffffffffffffef20._0_8_;
        val_24.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
        UniValue::pushKV(&o,key_21,val_24);
        UniValue::~UniValue(&local_e10);
        std::__cxx11::string::~string(local_db8);
        local_e30 = local_e20;
        local_e28 = 0;
        local_e20[0] = 0;
        str_07._M_string_length = (size_type)tx;
        str_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        str_07.field_2._M_allocated_capacity = (size_type)pCVar18;
        str_07.field_2._8_8_ = in_stack_ffffffffffffeee0;
        UniValue::UniValue(&p,VOBJ,str_07);
        std::__cxx11::string::~string((string *)&local_e30);
        ScriptToUniv(&pCVar13->scriptPubKey,&p,true,true,(SigningProvider *)0x0);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_e50,"scriptPubKey",(allocator<char> *)&stack0xffffffffffffef10);
        UniValue::UniValue(&local_ea8,&p);
        key_22._M_string_length = (size_type)tx;
        key_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        key_22.field_2._M_allocated_capacity = (size_type)pCVar18;
        key_22.field_2._8_8_ = in_stack_ffffffffffffeee0;
        val_25.val._M_dataplus._M_p = (pointer)txundo;
        val_25._0_8_ = lVar21;
        val_25.val._M_string_length._0_4_ = uVar15;
        val_25.val._M_string_length._4_4_ = verbosity;
        val_25.val.field_2._M_allocated_capacity = (size_type)entry;
        val_25.val.field_2._8_8_ = block_hash;
        val_25.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
        val_25.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
        val_25.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
        val_25.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_ffffffffffffef20._0_8_;
        val_25.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
        UniValue::pushKV(&o,key_22,val_25);
        UniValue::~UniValue(&local_ea8);
        std::__cxx11::string::~string(local_e50);
        UniValue::UniValue(&local_f00,&o);
        val_01.val._M_dataplus._M_p = (pointer)tx;
        val_01._0_8_ = in_stack_ffffffffffffeec8;
        val_01.val._M_string_length = (size_type)pCVar18;
        val_01.val.field_2._M_allocated_capacity = in_stack_ffffffffffffeee0;
        val_01.val.field_2._8_8_ = lVar21;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)txundo;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = uVar15;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = verbosity;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)entry;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)block_hash;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef10;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_ffffffffffffef18;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_ffffffffffffef1f;
        UniValue::push_back(&vout,val_01);
        UniValue::~UniValue(&local_f00);
        pCVar8 = txundo;
        if (txundo != (CTxUndo *)0x0) {
          pCVar8 = (CTxUndo *)pCVar13->nValue;
        }
        pvVar16 = &pCVar8->vprevout + (long)pvVar16;
        UniValue::~UniValue(&p);
        UniValue::~UniValue(&o);
        uVar11 = (int)pCVar18 + 1;
        pCVar20 = pCVar18;
      }
      std::__cxx11::string::string<std::allocator<char>>(local_f20,"vout",(allocator<char> *)&o);
      UniValue::UniValue(&local_f78,&vout);
      key_23._M_string_length = (size_type)tx;
      key_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_23.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_23.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_26.val._M_dataplus._M_p = (pointer)txundo;
      val_26._0_8_ = lVar21;
      val_26.val._M_string_length._0_4_ = uVar15;
      val_26.val._M_string_length._4_4_ = verbosity;
      val_26.val.field_2._M_allocated_capacity = (size_type)entry;
      val_26.val.field_2._8_8_ = block_hash;
      val_26.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_26.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_26.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_26.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_26.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      pUVar22 = entry;
      UniValue::pushKV(entry,key_23,val_26);
      pbVar23 = (base_blob<256u> *)block_hash;
      UniValue::~UniValue(&local_f78);
      std::__cxx11::string::~string(local_f20);
      if (txundo != (CTxUndo *)0x0) {
        uVar14 = lVar21 - (long)pvVar16;
        o.typ._0_1_ = uVar14 < 0x775f05a074001;
        inline_check_non_fatal<bool>
                  ((bool *)&o,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/core_write.cpp"
                   ,0x100,"TxToUniv","MoneyRange(fee)");
        std::__cxx11::string::string<std::allocator<char>>(local_f98,"fee",(allocator<char> *)&o);
        ValueFromAmount(&local_ff0,uVar14);
        key_24._M_string_length = (size_type)tx;
        key_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        key_24.field_2._M_allocated_capacity = (size_type)pCVar20;
        key_24.field_2._8_8_ = in_stack_ffffffffffffeee0;
        val_27.val._M_dataplus._M_p = (pointer)txundo;
        val_27._0_8_ = lVar21;
        val_27.val._M_string_length._0_4_ = uVar15;
        val_27.val._M_string_length._4_4_ = verbosity;
        val_27.val.field_2._M_allocated_capacity = (size_type)pUVar22;
        val_27.val.field_2._8_8_ = pbVar23;
        val_27.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
        val_27.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
        val_27.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
        val_27.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_ffffffffffffef20._0_8_;
        val_27.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
        UniValue::pushKV(entry,key_24,val_27);
        UniValue::~UniValue(&local_ff0);
        std::__cxx11::string::~string(local_f98);
      }
      bVar5 = base_blob<256U>::IsNull(&block_hash->super_base_blob<256U>);
      pCVar19 = tx;
      if (!bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1010,"blockhash",(allocator<char> *)&p);
        base_blob<256u>::GetHex_abi_cxx11_((string *)&o,(base_blob<256u> *)block_hash);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_1068,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        key_25._M_string_length = (size_type)pCVar19;
        key_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        key_25.field_2._M_allocated_capacity = (size_type)pCVar20;
        key_25.field_2._8_8_ = in_stack_ffffffffffffeee0;
        val_28.val._M_dataplus._M_p = (pointer)txundo;
        val_28._0_8_ = lVar21;
        val_28.val._M_string_length._0_4_ = uVar15;
        val_28.val._M_string_length._4_4_ = verbosity;
        val_28.val.field_2._M_allocated_capacity = (size_type)pUVar22;
        val_28.val.field_2._8_8_ = pbVar23;
        val_28.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
        val_28.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
        val_28.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
        val_28.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_ffffffffffffef20._0_8_;
        val_28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
        UniValue::pushKV(entry,key_25,val_28);
        UniValue::~UniValue(&local_1068);
        std::__cxx11::string::~string((string *)&o);
        std::__cxx11::string::~string(local_1010);
      }
      if ((char)uVar15 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>(local_1088,"hex",(allocator<char> *)&p);
        EncodeHexTx_abi_cxx11_((string *)&o,tx);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)&stack0xffffffffffffef20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        key_26._M_string_length = (size_type)pCVar19;
        key_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
        key_26.field_2._M_allocated_capacity = (size_type)pCVar20;
        key_26.field_2._8_8_ = in_stack_ffffffffffffeee0;
        val_29.val._M_dataplus._M_p = (pointer)txundo;
        val_29._0_8_ = lVar21;
        val_29.val._M_string_length._0_4_ = uVar15;
        val_29.val._M_string_length._4_4_ = verbosity;
        val_29.val.field_2._M_allocated_capacity = (size_type)pUVar22;
        val_29.val.field_2._8_8_ = pbVar23;
        val_29.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
        val_29.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
        val_29.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
        val_29.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_ffffffffffffef20._0_8_;
        val_29.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
        UniValue::pushKV(entry,key_26,val_29);
        UniValue::~UniValue((UniValue *)&stack0xffffffffffffef20);
        std::__cxx11::string::~string((string *)&o);
        std::__cxx11::string::~string(local_1088);
      }
      UniValue::~UniValue(&vout);
      UniValue::~UniValue(&vin);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    local_470 = local_460;
    local_468 = 0;
    local_460[0] = 0;
    str_00._M_string_length = (size_type)tx;
    str_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
    str_00.field_2._M_allocated_capacity = (size_type)pCVar20;
    str_00.field_2._8_8_ = in_stack_ffffffffffffeee0;
    UniValue::UniValue(&vout,VOBJ,str_00);
    pCVar19 = tx;
    std::__cxx11::string::~string((string *)&local_470);
    bVar5 = CTransaction::IsCoinBase(tx);
    pCVar20 = pCVar20 + uVar14;
    in_stack_ffffffffffffeee0 = uVar14;
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>(local_490,"coinbase",(allocator<char> *)&p)
      ;
      uVar11 = *(size_type *)((long)&(pCVar20->scriptSig).super_CScriptBase + 0x1c);
      uVar9 = uVar11 - 0x1d;
      pCVar1 = *(CScript **)&(pCVar20->scriptSig).super_CScriptBase._union;
      if (uVar11 < 0x1d) {
        uVar9 = uVar11;
        pCVar1 = &pCVar20->scriptSig;
      }
      s.m_size._0_4_ = uVar9;
      s.m_data = (uchar *)pCVar1;
      s.m_size._4_4_ = 0;
      HexStr_abi_cxx11_((string *)&o,s);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_4e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o)
      ;
      key_06._M_string_length = (size_type)pCVar19;
      key_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_06.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_06.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_09.val._M_dataplus._M_p = (pointer)txundo;
      val_09._0_8_ = lVar21;
      val_09.val._M_string_length._0_4_ = uVar15;
      val_09.val._M_string_length._4_4_ = verbosity;
      val_09.val.field_2._M_allocated_capacity = (size_type)entry;
      val_09.val.field_2._8_8_ = block_hash;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&vout,key_06,val_09);
      UniValue::~UniValue(&local_4e8);
      std::__cxx11::string::~string((string *)&o);
      std::__cxx11::string::~string(local_490);
      tx = pCVar19;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_508,"txid",(allocator<char> *)&p);
      base_blob<256u>::GetHex_abi_cxx11_((string *)&o,(base_blob<256u> *)pCVar20);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_560,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o)
      ;
      key_07._M_string_length = (size_type)pCVar19;
      key_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_07.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_07.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_10.val._M_dataplus._M_p = (pointer)txundo;
      val_10._0_8_ = lVar21;
      val_10.val._M_string_length._0_4_ = uVar15;
      val_10.val._M_string_length._4_4_ = verbosity;
      val_10.val.field_2._M_allocated_capacity = (size_type)entry;
      val_10.val.field_2._8_8_ = block_hash;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&vout,key_07,val_10);
      UniValue::~UniValue(&local_560);
      std::__cxx11::string::~string((string *)&o);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::string::string<std::allocator<char>>(local_580,"vout",(allocator<char> *)&p);
      o._0_8_ = ZEXT48((pCVar20->prevout).n);
      UniValue::UniValue<long,_long,_true>(&local_5d8,(long *)&o);
      key_08._M_string_length = (size_type)pCVar19;
      key_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_08.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_08.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_11.val._M_dataplus._M_p = (pointer)txundo;
      val_11._0_8_ = lVar21;
      val_11.val._M_string_length._0_4_ = uVar15;
      val_11.val._M_string_length._4_4_ = verbosity;
      val_11.val.field_2._M_allocated_capacity = (size_type)entry;
      val_11.val.field_2._8_8_ = block_hash;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&vout,key_08,val_11);
      UniValue::~UniValue(&local_5d8);
      std::__cxx11::string::~string(local_580);
      local_650 = local_640;
      local_648 = 0;
      local_640[0] = 0;
      str_01._M_string_length = (size_type)pCVar19;
      str_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      str_01.field_2._M_allocated_capacity = (size_type)pCVar20;
      str_01.field_2._8_8_ = in_stack_ffffffffffffeee0;
      UniValue::UniValue(&o,VOBJ,str_01);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::string<std::allocator<char>>
                (local_670,"asm",(allocator<char> *)&stack0xffffffffffffef10);
      pCVar1 = &pCVar20->scriptSig;
      ScriptToAsmStr_abi_cxx11_((string *)&p,pCVar1,true);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_6c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p)
      ;
      key_09._M_string_length = (size_type)pCVar19;
      key_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_09.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_09.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_12.val._M_dataplus._M_p = (pointer)txundo;
      val_12._0_8_ = lVar21;
      val_12.val._M_string_length._0_4_ = uVar15;
      val_12.val._M_string_length._4_4_ = verbosity;
      val_12.val.field_2._M_allocated_capacity = (size_type)entry;
      val_12.val.field_2._8_8_ = block_hash;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&o,key_09,val_12);
      UniValue::~UniValue(&local_6c8);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::~string(local_670);
      std::__cxx11::string::string<std::allocator<char>>
                (local_6e8,"hex",(allocator<char> *)&stack0xffffffffffffef10);
      uVar11 = *(size_type *)((long)&(pCVar20->scriptSig).super_CScriptBase + 0x1c);
      uVar9 = uVar11 - 0x1d;
      pCVar2 = *(CScript **)&(pCVar20->scriptSig).super_CScriptBase._union;
      if (uVar11 < 0x1d) {
        uVar9 = uVar11;
        pCVar2 = pCVar1;
      }
      s_00.m_size._0_4_ = uVar9;
      s_00.m_data = (uchar *)pCVar2;
      s_00.m_size._4_4_ = 0;
      HexStr_abi_cxx11_((string *)&p,s_00);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_740,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p)
      ;
      key_10._M_string_length = (size_type)pCVar19;
      key_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_10.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_10.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_13.val._M_dataplus._M_p = (pointer)txundo;
      val_13._0_8_ = lVar21;
      val_13.val._M_string_length._0_4_ = uVar15;
      val_13.val._M_string_length._4_4_ = verbosity;
      val_13.val.field_2._M_allocated_capacity = (size_type)entry;
      val_13.val.field_2._8_8_ = block_hash;
      val_13.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_13.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_13.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_13.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&o,key_10,val_13);
      UniValue::~UniValue(&local_740);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::~string(local_6e8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_760,"scriptSig",(allocator<char> *)&p);
      UniValue::UniValue(&local_7b8,&o);
      key_11._M_string_length = (size_type)pCVar19;
      key_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_11.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_11.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_14.val._M_dataplus._M_p = (pointer)txundo;
      val_14._0_8_ = lVar21;
      val_14.val._M_string_length._0_4_ = uVar15;
      val_14.val._M_string_length._4_4_ = verbosity;
      val_14.val.field_2._M_allocated_capacity = (size_type)entry;
      val_14.val.field_2._8_8_ = block_hash;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&vout,key_11,val_14);
      UniValue::~UniValue(&local_7b8);
      std::__cxx11::string::~string(local_760);
      UniValue::~UniValue(&o);
      tx = pCVar19;
    }
    pCVar18 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (*(pointer *)&pCVar18[uVar14].scriptWitness.stack !=
        *(pointer *)((long)&pCVar18[uVar14].scriptWitness.stack + 8)) {
      local_7d8 = local_7c8;
      local_7d0 = 0;
      local_7c8[0] = 0;
      str_02._M_string_length = (size_type)tx;
      str_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      str_02.field_2._M_allocated_capacity = (size_type)pCVar20;
      str_02.field_2._8_8_ = in_stack_ffffffffffffeee0;
      UniValue::UniValue(&o,VARR,str_02);
      std::__cxx11::string::~string((string *)&local_7d8);
      pCVar18 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar3 = *(pointer *)((long)&pCVar18[uVar14].scriptWitness.stack + 8);
      for (pvVar17 = *(pointer *)&pCVar18[uVar14].scriptWitness.stack; pvVar17 != pvVar3;
          pvVar17 = pvVar17 + 1) {
        puVar4 = *(uchar **)
                  &(pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl;
        s_01.m_size = (long)*(pointer *)
                             ((long)&(pvVar17->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl + 8) - (long)puVar4;
        s_01.m_data = puVar4;
        HexStr_abi_cxx11_((string *)&p,s_01);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_830,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
        val.val._M_dataplus._M_p = (pointer)tx;
        val._0_8_ = in_stack_ffffffffffffeec8;
        val.val._M_string_length = (size_type)pCVar20;
        val.val.field_2._M_allocated_capacity = in_stack_ffffffffffffeee0;
        val.val.field_2._8_8_ = lVar21;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)txundo;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = uVar15;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = verbosity;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)entry;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)block_hash;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef10;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_ffffffffffffef18;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_ffffffffffffef1f;
        UniValue::push_back(&o,val);
        UniValue::~UniValue(&local_830);
        std::__cxx11::string::~string((string *)&p);
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_850,"txinwitness",(allocator<char> *)&p);
      UniValue::UniValue(&local_8a8,&o);
      key_12._M_string_length = (size_type)tx;
      key_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_12.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_12.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_15.val._M_dataplus._M_p = (pointer)txundo;
      val_15._0_8_ = lVar21;
      val_15.val._M_string_length._0_4_ = uVar15;
      val_15.val._M_string_length._4_4_ = verbosity;
      val_15.val.field_2._M_allocated_capacity = (size_type)entry;
      val_15.val.field_2._8_8_ = block_hash;
      val_15.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_15.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_15.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_15.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&vout,key_12,val_15);
      UniValue::~UniValue(&local_8a8);
      std::__cxx11::string::~string(local_850);
      UniValue::~UniValue(&o);
    }
    if (txundo == (CTxUndo *)0x0) {
LAB_00140729:
      iVar10 = (int)in_stack_ffffffffffffeee0;
    }
    else {
      lVar21 = lVar21 + *(long *)(*(long *)txundo + in_stack_ffffffffffffeee0 * 0x30);
      if (verbosity != SHOW_DETAILS_AND_PREVOUT) goto LAB_00140729;
      pCVar12 = (CAmount *)(*(long *)txundo + in_stack_ffffffffffffeee0 * 0x30);
      local_8c8 = local_8b8;
      local_8c0 = 0;
      local_8b8[0] = 0;
      str_03._M_string_length = (size_type)tx;
      str_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      str_03.field_2._M_allocated_capacity = (size_type)pCVar20;
      str_03.field_2._8_8_ = in_stack_ffffffffffffeee0;
      UniValue::UniValue(&o,VOBJ,str_03);
      std::__cxx11::string::~string((string *)&local_8c8);
      ScriptToUniv((CScript *)(pCVar12 + 1),&o,true,true,(SigningProvider *)0x0);
      local_940 = local_930;
      local_938 = 0;
      local_930[0] = 0;
      str_04._M_string_length = (size_type)tx;
      str_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      str_04.field_2._M_allocated_capacity = (size_type)pCVar20;
      str_04.field_2._8_8_ = in_stack_ffffffffffffeee0;
      UniValue::UniValue(&p,VOBJ,str_04);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::string<std::allocator<char>>
                (local_960,"generated",(allocator<char> *)&stack0xffffffffffffef10);
      in_stack_ffffffffffffef1f = (allocator<char>)(*(byte *)(pCVar12 + 5) & 1);
      UniValue::UniValue<bool,_bool,_true>(&local_9b8,(bool *)&stack0xffffffffffffef1f);
      key_13._M_string_length = (size_type)tx;
      key_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_13.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_13.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_16.val._M_dataplus._M_p = (pointer)txundo;
      val_16._0_8_ = lVar21;
      val_16.val._M_string_length._0_4_ = uVar15;
      val_16.val._M_string_length._4_4_ = verbosity;
      val_16.val.field_2._M_allocated_capacity = (size_type)entry;
      val_16.val.field_2._8_8_ = block_hash;
      val_16.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_16.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_16.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_16.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&p,key_13,val_16);
      UniValue::~UniValue(&local_9b8);
      std::__cxx11::string::~string(local_960);
      std::__cxx11::string::string<std::allocator<char>>
                (local_9d8,"height",(allocator<char> *)&stack0xffffffffffffef1f);
      in_stack_ffffffffffffef10 = (ulong)(*(uint *)(pCVar12 + 5) >> 1);
      UniValue::UniValue<unsigned_long,_unsigned_long,_true>
                (&local_a30,(unsigned_long *)&stack0xffffffffffffef10);
      key_14._M_string_length = (size_type)tx;
      key_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_14.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_14.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_17.val._M_dataplus._M_p = (pointer)txundo;
      val_17._0_8_ = lVar21;
      val_17.val._M_string_length._0_4_ = uVar15;
      val_17.val._M_string_length._4_4_ = verbosity;
      val_17.val.field_2._M_allocated_capacity = (size_type)entry;
      val_17.val.field_2._8_8_ = block_hash;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_17.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&p,key_14,val_17);
      UniValue::~UniValue(&local_a30);
      std::__cxx11::string::~string(local_9d8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a50,"value",(allocator<char> *)&stack0xffffffffffffef10);
      ValueFromAmount(&local_aa8,*pCVar12);
      key_15._M_string_length = (size_type)tx;
      key_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_15.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_15.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_18.val._M_dataplus._M_p = (pointer)txundo;
      val_18._0_8_ = lVar21;
      val_18.val._M_string_length._0_4_ = uVar15;
      val_18.val._M_string_length._4_4_ = verbosity;
      val_18.val.field_2._M_allocated_capacity = (size_type)entry;
      val_18.val.field_2._8_8_ = block_hash;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_18.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_18.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&p,key_15,val_18);
      iVar10 = (int)in_stack_ffffffffffffeee0;
      UniValue::~UniValue(&local_aa8);
      std::__cxx11::string::~string(local_a50);
      std::__cxx11::string::string<std::allocator<char>>
                (local_ac8,"scriptPubKey",(allocator<char> *)&stack0xffffffffffffef10);
      UniValue::UniValue(&local_b20,&o);
      key_16._M_string_length = (size_type)tx;
      key_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_16.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_16.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_19.val._M_dataplus._M_p = (pointer)txundo;
      val_19._0_8_ = lVar21;
      val_19.val._M_string_length._0_4_ = uVar15;
      val_19.val._M_string_length._4_4_ = verbosity;
      val_19.val.field_2._M_allocated_capacity = (size_type)entry;
      val_19.val.field_2._8_8_ = block_hash;
      val_19.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_19.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_19.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_19.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_19.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&p,key_16,val_19);
      UniValue::~UniValue(&local_b20);
      std::__cxx11::string::~string(local_ac8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_b40,"prevout",(allocator<char> *)&stack0xffffffffffffef10);
      UniValue::UniValue(&local_b98,&p);
      key_17._M_string_length = (size_type)tx;
      key_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
      key_17.field_2._M_allocated_capacity = (size_type)pCVar20;
      key_17.field_2._8_8_ = in_stack_ffffffffffffeee0;
      val_20.val._M_dataplus._M_p = (pointer)txundo;
      val_20._0_8_ = lVar21;
      val_20.val._M_string_length._0_4_ = uVar15;
      val_20.val._M_string_length._4_4_ = verbosity;
      val_20.val.field_2._M_allocated_capacity = (size_type)entry;
      val_20.val.field_2._8_8_ = block_hash;
      val_20.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
      val_20.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
      val_20.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
      val_20.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
      val_20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
      UniValue::pushKV(&vout,key_17,val_20);
      UniValue::~UniValue(&local_b98);
      std::__cxx11::string::~string(local_b40);
      UniValue::~UniValue(&p);
      UniValue::~UniValue(&o);
    }
    std::__cxx11::string::string<std::allocator<char>>(local_bb8,"sequence",(allocator<char> *)&p);
    o._0_8_ = ZEXT48(pCVar20->nSequence);
    UniValue::UniValue<long,_long,_true>(&local_c10,(long *)&o);
    key_18._M_string_length = (size_type)tx;
    key_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeec8;
    key_18.field_2._M_allocated_capacity = (size_type)pCVar20;
    key_18.field_2._8_8_ = in_stack_ffffffffffffeee0;
    val_21.val._M_dataplus._M_p = (pointer)txundo;
    val_21._0_8_ = lVar21;
    val_21.val._M_string_length._0_4_ = uVar15;
    val_21.val._M_string_length._4_4_ = verbosity;
    val_21.val.field_2._M_allocated_capacity = (size_type)entry;
    val_21.val.field_2._8_8_ = block_hash;
    val_21.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
    val_21.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_ffffffffffffef18;
    val_21.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_ffffffffffffef1f;
    val_21.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20._0_8_;
    val_21.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffef20._8_24_;
    UniValue::pushKV(&vout,key_18,val_21);
    UniValue::~UniValue(&local_c10);
    std::__cxx11::string::~string(local_bb8);
    UniValue::UniValue(&local_c68,&vout);
    val_00.val._M_dataplus._M_p = (pointer)tx;
    val_00._0_8_ = in_stack_ffffffffffffeec8;
    val_00.val._M_string_length = (size_type)pCVar20;
    val_00.val.field_2._M_allocated_capacity = in_stack_ffffffffffffeee0;
    val_00.val.field_2._8_8_ = lVar21;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)txundo;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = uVar15;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = verbosity;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)entry;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)block_hash;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef10;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_ffffffffffffef18;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_ffffffffffffef1f;
    UniValue::push_back(&vin,val_00);
    UniValue::~UniValue(&local_c68);
    UniValue::~UniValue(&vout);
    uVar11 = iVar10 + 1;
  } while( true );
}

Assistant:

void TxToUniv(const CTransaction& tx, const uint256& block_hash, UniValue& entry, bool include_hex, const CTxUndo* txundo, TxVerbosity verbosity)
{
    CHECK_NONFATAL(verbosity >= TxVerbosity::SHOW_DETAILS);

    entry.pushKV("txid", tx.GetHash().GetHex());
    entry.pushKV("hash", tx.GetWitnessHash().GetHex());
    entry.pushKV("version", tx.version);
    entry.pushKV("size", tx.GetTotalSize());
    entry.pushKV("vsize", (GetTransactionWeight(tx) + WITNESS_SCALE_FACTOR - 1) / WITNESS_SCALE_FACTOR);
    entry.pushKV("weight", GetTransactionWeight(tx));
    entry.pushKV("locktime", (int64_t)tx.nLockTime);

    UniValue vin{UniValue::VARR};

    // If available, use Undo data to calculate the fee. Note that txundo == nullptr
    // for coinbase transactions and for transactions where undo data is unavailable.
    const bool have_undo = txundo != nullptr;
    CAmount amt_total_in = 0;
    CAmount amt_total_out = 0;

    for (unsigned int i = 0; i < tx.vin.size(); i++) {
        const CTxIn& txin = tx.vin[i];
        UniValue in(UniValue::VOBJ);
        if (tx.IsCoinBase()) {
            in.pushKV("coinbase", HexStr(txin.scriptSig));
        } else {
            in.pushKV("txid", txin.prevout.hash.GetHex());
            in.pushKV("vout", (int64_t)txin.prevout.n);
            UniValue o(UniValue::VOBJ);
            o.pushKV("asm", ScriptToAsmStr(txin.scriptSig, true));
            o.pushKV("hex", HexStr(txin.scriptSig));
            in.pushKV("scriptSig", std::move(o));
        }
        if (!tx.vin[i].scriptWitness.IsNull()) {
            UniValue txinwitness(UniValue::VARR);
            for (const auto& item : tx.vin[i].scriptWitness.stack) {
                txinwitness.push_back(HexStr(item));
            }
            in.pushKV("txinwitness", std::move(txinwitness));
        }
        if (have_undo) {
            const Coin& prev_coin = txundo->vprevout[i];
            const CTxOut& prev_txout = prev_coin.out;

            amt_total_in += prev_txout.nValue;

            if (verbosity == TxVerbosity::SHOW_DETAILS_AND_PREVOUT) {
                UniValue o_script_pub_key(UniValue::VOBJ);
                ScriptToUniv(prev_txout.scriptPubKey, /*out=*/o_script_pub_key, /*include_hex=*/true, /*include_address=*/true);

                UniValue p(UniValue::VOBJ);
                p.pushKV("generated", bool(prev_coin.fCoinBase));
                p.pushKV("height", uint64_t(prev_coin.nHeight));
                p.pushKV("value", ValueFromAmount(prev_txout.nValue));
                p.pushKV("scriptPubKey", std::move(o_script_pub_key));
                in.pushKV("prevout", std::move(p));
            }
        }
        in.pushKV("sequence", (int64_t)txin.nSequence);
        vin.push_back(std::move(in));
    }
    entry.pushKV("vin", std::move(vin));

    UniValue vout(UniValue::VARR);
    for (unsigned int i = 0; i < tx.vout.size(); i++) {
        const CTxOut& txout = tx.vout[i];

        UniValue out(UniValue::VOBJ);

        out.pushKV("value", ValueFromAmount(txout.nValue));
        out.pushKV("n", (int64_t)i);

        UniValue o(UniValue::VOBJ);
        ScriptToUniv(txout.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
        out.pushKV("scriptPubKey", std::move(o));
        vout.push_back(std::move(out));

        if (have_undo) {
            amt_total_out += txout.nValue;
        }
    }
    entry.pushKV("vout", std::move(vout));

    if (have_undo) {
        const CAmount fee = amt_total_in - amt_total_out;
        CHECK_NONFATAL(MoneyRange(fee));
        entry.pushKV("fee", ValueFromAmount(fee));
    }

    if (!block_hash.IsNull()) {
        entry.pushKV("blockhash", block_hash.GetHex());
    }

    if (include_hex) {
        entry.pushKV("hex", EncodeHexTx(tx)); // The hex-encoded transaction. Used the name "hex" to be consistent with the verbose output of "getrawtransaction".
    }
}